

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O1

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
VulkanHppGenerator::generateProtection
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,VulkanHppGenerator *this,string *protect,bool defined)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  char *__lhs;
  size_type *local_b0;
  size_type local_a0;
  undefined8 uStack_98;
  ulong *local_90;
  undefined8 local_88;
  ulong local_80;
  undefined8 uStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  pair<const_char_*,_const_char_*> local_30;
  
  sVar1 = protect->_M_string_length;
  if (sVar1 == 0) {
    local_30.first = "";
    local_30.second = "";
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_*,_const_char_*,_true>(__return_storage_ptr__,&local_30);
  }
  else {
    __lhs = "#if !defined( ";
    if (defined) {
      __lhs = "#if defined( ";
    }
    std::operator+(&local_50,__lhs,protect);
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_50," )\n");
    local_b0 = (size_type *)(pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0 == paVar5) {
      local_a0 = paVar5->_M_allocated_capacity;
      uStack_98 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      local_b0 = &local_a0;
    }
    else {
      local_a0 = paVar5->_M_allocated_capacity;
    }
    sVar2 = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    std::operator+(&local_70,"#endif /*",protect);
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_70,"*/\n");
    local_90 = (ulong *)(pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90 == paVar5) {
      local_80 = paVar5->_M_allocated_capacity;
      uStack_78 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      local_90 = &local_80;
    }
    else {
      local_80 = paVar5->_M_allocated_capacity;
    }
    sVar3 = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    paVar5 = &(__return_storage_ptr__->first).field_2;
    (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)paVar5;
    if (local_b0 == &local_a0) {
      paVar5->_M_allocated_capacity = local_a0;
      *(undefined8 *)((long)&(__return_storage_ptr__->first).field_2 + 8) = uStack_98;
    }
    else {
      (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)local_b0;
      (__return_storage_ptr__->first).field_2._M_allocated_capacity = local_a0;
    }
    (__return_storage_ptr__->first)._M_string_length = sVar2;
    local_a0 = local_a0 & 0xffffffffffffff00;
    paVar5 = &(__return_storage_ptr__->second).field_2;
    (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)paVar5;
    if (local_90 == &local_80) {
      paVar5->_M_allocated_capacity = local_80;
      *(undefined8 *)((long)&(__return_storage_ptr__->second).field_2 + 8) = uStack_78;
    }
    else {
      (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)local_90;
      (__return_storage_ptr__->second).field_2._M_allocated_capacity = local_80;
    }
    (__return_storage_ptr__->second)._M_string_length = sVar3;
    local_88 = 0;
    local_80 = local_80 & 0xffffffffffffff00;
    local_b0 = &local_a0;
    local_90 = &local_80;
  }
  if (sVar1 != 0) {
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, std::string> VulkanHppGenerator::generateProtection( std::string const & protect, bool defined ) const
{
  auto const openProtect = defined ? "#if defined( " : "#if !defined( ";
  return protect.empty() ? std::make_pair( "", "" ) : std::make_pair( openProtect + protect + " )\n", "#endif /*" + protect + "*/\n" );
}